

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O3

void sho_obj_return_to_u(obj *obj,schar dx,schar dy)

{
  boolean bVar1;
  int iVar2;
  int iVar3;
  int x;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  
  iVar7 = (int)bhitpos.x;
  if ((bhitpos.x == u.ux) && (bhitpos.y == u.uy)) {
    return;
  }
  iVar5 = (int)bhitpos.y;
  iVar2 = (int)dx;
  iVar3 = (int)dy;
  if ((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) {
LAB_00182416:
    iVar4 = (int)obj->otyp;
  }
  else {
    if (u.umonnum != u.umonster) {
      bVar1 = dmgtype(youmonst.data,0x24);
      if (bVar1 != '\0') goto LAB_00182416;
    }
    iVar4 = display_rng(0x219);
    iVar4 = iVar4 + 1;
  }
  tmp_at(-4,iVar4 + 1);
  iVar4 = iVar5 - iVar3;
  x = iVar7 - iVar2;
  if ((x != u.ux) || (iVar4 != u.uy)) {
    iVar7 = iVar7 + iVar2 * -2;
    iVar5 = iVar5 + iVar3 * -2;
    do {
      do {
        iVar6 = iVar5;
        tmp_at(x,iVar4);
        (*windowprocs.win_delay)();
        iVar4 = iVar4 - iVar3;
        x = x - iVar2;
        iVar8 = iVar7 - iVar2;
        iVar5 = iVar6 - iVar3;
        bVar9 = iVar7 != u.ux;
        iVar7 = iVar8;
      } while (bVar9);
    } while (iVar6 != u.uy);
  }
  tmp_at(-6,0);
  return;
}

Assistant:

static void sho_obj_return_to_u(struct obj *obj, schar dx, schar dy)
{
    /* might already be our location (bounced off a wall) */
    if (bhitpos.x != u.ux || bhitpos.y != u.uy) {
	int x = bhitpos.x - dx;
	int y = bhitpos.y - dy;
	
	tmp_at(DISP_OBJECT, dbuf_objid(obj));
	while (x != u.ux || y != u.uy) {
	    tmp_at(x, y);
	    win_delay_output();
	    x -= dx; y -= dy;
	}
	tmp_at(DISP_END, 0);
    }
}